

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderConstExprTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderConstExprTests::init(ShaderConstExprTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  int i;
  long lVar2;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary local_28;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            (&local_28,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile(&children,&local_28,"shaders/constant_expressions.test");
  deqp::gls::ShaderLibrary::~ShaderLibrary(&local_28);
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); lVar2 = lVar2 + 1
      ) {
    tcu::TestNode::addChild
              ((TestNode *)this,
               children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar2]);
  }
  node = (TestNode *)operator_new(0x78);
  ShaderConstExprBuiltinTests::ShaderConstExprBuiltinTests
            ((ShaderConstExprBuiltinTests *)node,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,node);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  return extraout_EAX;
}

Assistant:

void ShaderConstExprTests::init (void)
{
	const std::vector<tcu::TestNode*> children = gls::ShaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo()).loadShaderFile("shaders/constant_expressions.test");

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);

	addChild(new ShaderConstExprBuiltinTests(m_context));
}